

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QDBusPlatformMenuItem ** __thiscall
QHash<int,_QDBusPlatformMenuItem_*>::operator[](QHash<int,_QDBusPlatformMenuItem_*> *this,int *key)

{
  QDBusPlatformMenuItem **ppQVar1;
  long in_FS_OFFSET;
  int *in_stack_ffffffffffffffb8;
  QHash<int,_QDBusPlatformMenuItem_*> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  ppQVar1 = iterator::operator*((iterator *)0xb19e83);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ppQVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }